

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
* __thiscall
nlohmann::
json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::get_checked(json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *ptr)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  parse_error *__return_storage_ptr__;
  out_of_range *poVar4;
  pointer __lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  __lhs = (this->reference_tokens).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->reference_tokens).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (__lhs == pbVar1) {
      return ptr;
    }
    if (ptr->m_type == array) {
      bVar2 = std::operator==(__lhs,"-");
      if (bVar2) {
        poVar4 = (out_of_range *)__cxa_allocate_exception(0x20);
        std::__cxx11::to_string
                  (&local_48,
                   (long)(((ptr->m_value).array)->
                         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(((ptr->m_value).array)->
                         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 4);
        std::operator+(&bStack_88,"array index \'-\' (",&local_48);
        std::operator+(&local_68,&bStack_88,") is out of range");
        detail::out_of_range::create(poVar4,0x192,&local_68);
        __cxa_throw(poVar4,&detail::out_of_range::typeinfo,detail::exception::~exception);
      }
      if ((1 < __lhs->_M_string_length) && (*(__lhs->_M_dataplus)._M_p == '0')) {
        __return_storage_ptr__ = (parse_error *)__cxa_allocate_exception(0x28);
        std::operator+(&bStack_88,"array index \'",__lhs);
        std::operator+(&local_68,&bStack_88,"\' must not begin with \'0\'");
        detail::parse_error::create(__return_storage_ptr__,0x6a,0,&local_68);
        __cxa_throw(__return_storage_ptr__,&detail::parse_error::typeinfo,
                    detail::exception::~exception);
      }
      iVar3 = array_index(__lhs);
      ptr = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::at(ptr,(long)iVar3);
    }
    else {
      if (ptr->m_type != object) {
        poVar4 = (out_of_range *)__cxa_allocate_exception(0x20);
        std::operator+(&bStack_88,"unresolved reference token \'",__lhs);
        std::operator+(&local_68,&bStack_88,"\'");
        detail::out_of_range::create(poVar4,0x194,&local_68);
        __cxa_throw(poVar4,&detail::out_of_range::typeinfo,detail::exception::~exception);
      }
      ptr = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::at(ptr,__lhs);
    }
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

const BasicJsonType& get_checked(const BasicJsonType* ptr) const {
		using size_type = typename BasicJsonType::size_type;
		for (const auto& reference_token : reference_tokens) {
			switch (ptr->m_type) {
				case detail::value_t::object: {
					// note: at performs range check
					ptr = &ptr->at(reference_token);
					break;
				}

				case detail::value_t::array: {
					if (JSON_UNLIKELY(reference_token == "-")) {
						// "-" always fails the range check
						JSON_THROW(detail::out_of_range::create(
							402,
							"array index '-' (" + std::to_string(ptr->m_value.array->size()) + ") is out of range"));
					}

					// error condition (cf. RFC 6901, Sect. 4)
					if (JSON_UNLIKELY(reference_token.size() > 1 and reference_token[0] == '0')) {
						JSON_THROW(detail::parse_error::create(
							106, 0, "array index '" + reference_token + "' must not begin with '0'"));
					}

					// note: at performs range check
					JSON_TRY { ptr = &ptr->at(static_cast<size_type>(array_index(reference_token))); }
					JSON_CATCH(std::invalid_argument&) {
						JSON_THROW(detail::parse_error::create(
							109, 0, "array index '" + reference_token + "' is not a number"));
					}
					break;
				}

				default:
					JSON_THROW(
						detail::out_of_range::create(404, "unresolved reference token '" + reference_token + "'"));
			}